

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_z.c
# Opt level: O3

void test_option_z(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  size_t in_RAX;
  char *pcVar3;
  size_t s;
  
  s = in_RAX;
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_z.c"
                      ,L'\x10',"f",L'Ƥ',L'\xffffffff',"a");
  wVar1 = systemf("echo f | %s -oz >archive.out 2>archive.err",testprog);
  pcVar3 = slurpfile(&s,"archive.err");
  free(pcVar3);
  if (wVar1 == L'\0') {
    pcVar3 = slurpfile(&s,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_z.c"
                     ,L'\"',(uint)(4 < s),"s > 4",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_z.c"
                        ,L'#',pcVar3,"p",anon_var_dwarf_16137,"\"\\x1f\\x8b\\x08\\x00\"",4,"4",
                        (void *)0x0);
    free(pcVar3);
  }
  else {
    wVar2 = canGzip();
    if (wVar2 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_z.c"
                     ,L'\x19');
      test_skipping("gzip is not supported on this platform");
    }
    else {
      failure("-z option is broken");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_z.c"
                          ,L'\x1d',(long)wVar1,"r",0,"0",(void *)0x0);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_z)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with gzip compression. */
	r = systemf("echo f | %s -oz >archive.out 2>archive.err",
	    testprog);
	p = slurpfile(&s, "archive.err");
	free(p);
	if (r != 0) {
		if (!canGzip()) {
			skipping("gzip is not supported on this platform");
			return;
		}
		failure("-z option is broken");
		assertEqualInt(r, 0);
		return;
	}
	/* Check that the archive file has a gzip signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 4);
	assertEqualMem(p, "\x1f\x8b\x08\x00", 4);
	free(p);
}